

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O3

void * __thiscall
nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket
          (IibAllocatorBase *this,size_t sz,uint8_t szidx)

{
  undefined8 *puVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  ulong idx;
  ulong uVar3;
  size_t bucketSz;
  MultipageData mpData;
  MultipageData local_48;
  
  uVar3 = CONCAT71(in_register_00000011,szidx);
  bVar2 = (byte)(uVar3 >> 1);
  idx = uVar3 & 0xffffffff;
  uVar3 = (-4L << (bVar2 & 0x3f) & -(ulong)((uint)uVar3 & 1)) + (-8L << (bVar2 & 0x3f)) &
          0xfffffffffffffff8;
  if (uVar3 == 0) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x439,"bucketSz >= sizeof( void* )",true);
  }
  bucketSz = -uVar3;
  SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::
  getMultipage(&this->pageAllocator,idx,&local_48);
  formatAllocatedPageAlignedBlock(this,(uint8_t *)local_48.ptr1,local_48.sz1,bucketSz,szidx);
  formatAllocatedPageAlignedBlock(this,(uint8_t *)local_48.ptr2,local_48.sz2,bucketSz,szidx);
  puVar1 = (undefined8 *)this->buckets[idx];
  this->buckets[idx] = (void *)*puVar1;
  return puVar1;
}

Assistant:

NODECPP_NOINLINE void* allocateInCaseNoFreeBucket( size_t sz, uint8_t szidx )
	{
#ifdef USE_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSize( szidx );
#elif defined USE_HALF_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSizeHalfExp( szidx );
#elif defined USE_QUAD_EXP_BUCKET_SIZES
		size_t bucketSz = indexToBucketSizeQuarterExp( szidx );
#else
#error Undefined bucket size schema
#endif
		NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, bucketSz >= sizeof( void* ) );
		PageAllocatorT::MultipageData mpData;
//		uint8_t* block = reinterpret_cast<uint8_t*>( pageAllocator.getPage( szidx ) );
		pageAllocator.getMultipage( szidx, mpData );
		formatAllocatedPageAlignedBlock( reinterpret_cast<uint8_t*>( mpData.ptr1 ), mpData.sz1, bucketSz, szidx );
		formatAllocatedPageAlignedBlock( reinterpret_cast<uint8_t*>( mpData.ptr2 ), mpData.sz2, bucketSz, szidx );
		void* ret = buckets[szidx];
		buckets[szidx] = *reinterpret_cast<void**>(buckets[szidx]);
		return ret;
	}